

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,bool value,string *url)

{
  ostream *poVar1;
  TAG *this_00;
  ostream *stream;
  char *__s;
  TD td;
  CENTER center;
  stringstream href;
  A a;
  TR tr;
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  TAG local_890;
  TAG local_6d8;
  stringstream local_520 [16];
  ostream local_510 [376];
  TAG local_398;
  TAG local_1e0;
  
  stream = (ostream *)(s + 0x10);
  HTML::TR::TR((TR *)&local_1e0,stream);
  HTML::TAG::text(&local_1e0);
  HTML::TD::TD((TD *)&local_890,stream);
  HTML::TAG::text(&local_890,name);
  HTML::TAG::~TAG(&local_890);
  HTML::TD::TD((TD *)&local_890,stream);
  __s = "no";
  if (value) {
    __s = "yes";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,__s,(allocator<char> *)&local_398);
  HTML::TAG::text(&local_890,(string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6d8);
  HTML::TAG::~TAG(&local_890);
  HTML::TD::TD((TD *)&local_890,stream);
  HTML::TAG::text(&local_890);
  HTML::CENTER::CENTER((CENTER *)&local_6d8,stream);
  HTML::TAG::text(&local_6d8);
  if (url->_M_string_length != 0) {
    std::__cxx11::stringstream::stringstream(local_520);
    poVar1 = std::operator<<(local_510,(string *)url);
    poVar1 = std::operator<<(poVar1,"&");
    poVar1 = std::operator<<(poVar1,(string *)name);
    poVar1 = std::operator<<(poVar1,"=");
    std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    HTML::A::A((A *)&local_398,stream);
    std::__cxx11::stringbuf::str();
    this_00 = &HTML::A::href((A *)&local_398,&local_8b0)->super_TAG;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"toggle",&local_8d1);
    HTML::TAG::text(this_00,&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_8b0);
    HTML::TAG::~TAG(&local_398);
    std::__cxx11::stringstream::~stringstream(local_520);
  }
  HTML::TAG::~TAG(&local_6d8);
  HTML::TAG::~TAG(&local_890);
  HTML::TAG::~TAG(&local_1e0);
  return;
}

Assistant:

void HttpConnection::showRow
( std::stringstream& s, const std::string& name, bool value, const std::string& url )
{
    { TR tr(s); tr.text();
      { TD td(s); td.text(name); }
      { TD td(s); td.text(value ? "yes" : "no"); }
      { TD td(s); td.text();
        CENTER center(s); center.text();
        if( url.size() )
        {
          std::stringstream href;
          href << url << "&" << name << "=" << !value;
          A a(s); a.href(href.str()).text("toggle");
        }
      }
    }
}